

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::AdvancedAllMipsCS::Run(AdvancedAllMipsCS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  void *__s;
  ShaderImageLoadStoreBase *this_01;
  Vector<int,_4> *expected_value;
  GLenum internalformat;
  int layers;
  value_type_conflict5 *__val;
  Vector<int,_4> local_30;
  
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,8,0x8814,0x80,0x80);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_texture,6,'\0',0,0x88ba,0x8814);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture,5,'\0',0,0x88ba,0x8814);
  glu::CallLogWrapper::glBindImageTexture(this_00,2,this->m_texture,4,'\0',0,0x88ba,0x8814);
  layers = 0;
  glu::CallLogWrapper::glBindImageTexture(this_00,3,this->m_texture,3,'\0',0,0x88ba,0x8814);
  __s = operator_new(0x790);
  memset(__s,0,0x790);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x790,__s,0x88e4);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_store_program);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x20);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_load_program);
  glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  expected_value = (Vector<int,_4> *)0x790;
  internalformat = 1;
  this_01 = (ShaderImageLoadStoreBase *)
            glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x790,1);
  local_30.m_data[0] = 2;
  local_30.m_data[1] = 3;
  local_30.m_data[2] = 4;
  local_30.m_data[3] = 5;
  bVar1 = glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::CompareValues<tcu::Vector<int,4>>
                    (this_01,&local_30,1,expected_value,internalformat,layers);
  operator_delete(__s,0x790);
  return (ulong)bVar1 - 1;
}

Assistant:

virtual long Run()
	{
		const int kSize = 11;
		glBindTexture(GL_TEXTURE_2D, m_texture);
		glTexStorage2D(GL_TEXTURE_2D, 8, GL_RGBA32F, 128, 128);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_texture, 6, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(1, m_texture, 5, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(2, m_texture, 4, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(3, m_texture, 3, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);

		std::vector<GLubyte> data(kSize * kSize * 4 * 4);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &data[0], GL_STATIC_DRAW);

		glUseProgram(m_store_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		glUseProgram(m_load_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		ivec4* map_data = (ivec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);

		if (!CompareValues(map_data, kSize, ivec4(2, 3, 4, 5)))
			return ERROR;
		return NO_ERROR;
	}